

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O3

void __thiscall icu_63::RBBIRuleScanner::parse(RBBIRuleScanner *this)

{
  int iVar1;
  UParseError *pUVar2;
  int32_t iVar3;
  char cVar4;
  UBool UVar5;
  RBBIRuleBuilder *pRVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  UErrorCode *pUVar10;
  uint c;
  UErrorCode UVar11;
  int32_t *piVar12;
  bool bVar13;
  
  if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    nextChar(this,&this->fC);
    if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar8 = 1;
LAB_002a10f4:
      piVar12 = (int32_t *)(gRuleParseStateTable + uVar8 * 8);
      bVar7 = gRuleParseStateTable[uVar8 * 8 + 4];
      cVar4 = (this->fC).fEscaped;
      bVar13 = cVar4 == '\0';
      c = (this->fC).fChar;
      if ((0x7e < bVar7 || !bVar13) || c != bVar7) {
        do {
          if (bVar7 == 0xfe) {
            if (!bVar13) break;
          }
          else {
            if (bVar7 == 0xff) break;
            if (bVar7 == 0xfd && !bVar13) {
              if ((c | 0x20) == 0x70) break;
            }
            else {
              if (bVar7 == 0xfc && c == 0xffffffff) break;
              if ((bVar13 == true && (char)bVar7 < -0x10) && c != 0xffffffff) {
                UVar5 = UnicodeSet::contains
                                  ((UnicodeSet *)(&this->field_0x480 + (ulong)(bVar7 & 0x7f) * 0x58)
                                   ,c);
                if (UVar5 != '\0') break;
                cVar4 = (this->fC).fEscaped;
                c = (this->fC).fChar;
              }
            }
          }
          bVar7 = *(byte *)(piVar12 + 3);
          piVar12 = piVar12 + 2;
          bVar13 = cVar4 == '\0';
        } while ((0x7e < bVar7 || !bVar13) || c != bVar7);
      }
      UVar5 = doParseActions(this,*piVar12);
      if (UVar5 != '\0') {
        bVar7 = *(byte *)((long)piVar12 + 6);
        if (bVar7 != 0) {
          iVar1 = this->fStackPtr;
          this->fStackPtr = iVar1 + 1;
          iVar9 = iVar1 + 1;
          if (0x62 < iVar1) {
            pRVar6 = this->fRB;
            pUVar10 = pRVar6->fStatus;
            if (*pUVar10 < U_ILLEGAL_ARGUMENT_ERROR) {
              *pUVar10 = U_BRK_ERROR_START;
              pUVar2 = pRVar6->fParseError;
              if (pUVar2 != (UParseError *)0x0) {
                iVar3 = this->fCharNum;
                pUVar2->line = this->fLineNum;
                pUVar2->offset = iVar3;
                pUVar2->preContext[0] = L'\0';
                pUVar2->postContext[0] = L'\0';
              }
            }
            this->fStackPtr = iVar1;
            iVar9 = iVar1;
          }
          this->fStack[iVar9] = (ushort)bVar7;
        }
        if (*(char *)((long)piVar12 + 7) != '\0') {
          nextChar(this,&this->fC);
        }
        uVar8 = (ulong)*(byte *)((long)piVar12 + 5);
        if (*(byte *)((long)piVar12 + 5) == 0xff) {
          iVar1 = this->fStackPtr;
          uVar8 = (ulong)this->fStack[iVar1];
          this->fStackPtr = iVar1 + -1;
          pRVar6 = this->fRB;
          if ((long)iVar1 < 1) {
            if (*pRVar6->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
              *pRVar6->fStatus = U_BRK_ERROR_START;
              pUVar2 = pRVar6->fParseError;
              if (pUVar2 != (UParseError *)0x0) {
                iVar3 = this->fCharNum;
                pUVar2->line = this->fLineNum;
                pUVar2->offset = iVar3;
                pUVar2->preContext[0] = L'\0';
                pUVar2->postContext[0] = L'\0';
              }
            }
            this->fStackPtr = iVar1;
          }
        }
        else {
          pRVar6 = this->fRB;
        }
        pUVar10 = pRVar6->fStatus;
        UVar11 = *pUVar10;
        if ((U_ZERO_ERROR < UVar11) || ((short)uVar8 == 0)) goto LAB_002a12d3;
        goto LAB_002a10f4;
      }
      pRVar6 = this->fRB;
      pUVar10 = pRVar6->fStatus;
      UVar11 = *pUVar10;
LAB_002a12d3:
      if ((UVar11 < U_ILLEGAL_ARGUMENT_ERROR) && (pRVar6->fForwardTree == (RBBINode *)0x0)) {
        *pUVar10 = U_BRK_RULE_SYNTAX;
        pUVar2 = pRVar6->fParseError;
        if (pUVar2 != (UParseError *)0x0) {
          iVar3 = this->fCharNum;
          pUVar2->line = this->fLineNum;
          pUVar2->offset = iVar3;
          pUVar2->preContext[0] = L'\0';
          pUVar2->postContext[0] = L'\0';
        }
      }
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::parse() {
    uint16_t                state;
    const RBBIRuleTableEl  *tableEl;

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }

    state = 1;
    nextChar(fC);
    //
    // Main loop for the rule parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next input char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  RBBI rule file parsing stops on the first error encountered.
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }

        // Quit if state == 0.  This is the normal way to exit the state machine.
        //
        if (state == 0) {
            break;
        }

        // Find the state table element that matches the input char from the rule, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        #ifdef RBBI_DEBUG
            if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) {
                RBBIDebugPrintf("char, line, col = (\'%c\', %d, %d)    state=%s ",
                    fC.fChar, fLineNum, fCharNum, RBBIRuleStateNames[state]);
            }
        #endif

        for (;;) {
            #ifdef RBBI_DEBUG
                if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPrintf("."); fflush(stdout);}
            #endif
            if (tableEl->fCharClass < 127 && fC.fEscaped == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not escaped, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fEscaped)  {
                // Table row specified "escaped" and the char was escaped.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fEscaped &&
                (fC.fChar == 0x50 || fC.fChar == 0x70 ))  {
                // Table row specified "escaped P" and the char is either 'p' or 'P'.
                break;
            }
            if (tableEl->fCharClass == 252 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fEscaped == FALSE &&                                      //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT((tableEl->fCharClass-128) < UPRV_LENGTHOF(fRuleSets));
                if (fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPuts("");}

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions((int32_t)tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack overflow.");
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack underflow.");
                fStackPtr++;
            }
        }

    }

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }
    
    // If there are no forward rules set an error.
    //
    if (fRB->fForwardTree == NULL) {
        error(U_BRK_RULE_SYNTAX);
        return;
    }

    //
    // Parsing of the input RBBI rules is complete.
    // We now have a parse tree for the rule expressions
    // and a list of all UnicodeSets that are referenced.
    //
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "symbols")) {fSymbolTable->rbbiSymtablePrint();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "ptree")) {
        RBBIDebugPrintf("Completed Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fForwardTree, TRUE);
        RBBIDebugPrintf("\nCompleted Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fReverseTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeFwdTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeRevTree, TRUE);
    }
#endif
}